

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_sockaddr_is_loopback_(sockaddr *addr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  uint32_t uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  sockaddr_in6 *sin6;
  sockaddr_in *sin;
  sockaddr *addr_local;
  
  if (addr->sa_family == 2) {
    uVar7 = ntohl(*(uint32_t *)(addr->sa_data + 2));
    addr_local._4_4_ = (uint)((uVar7 & 0xff000000) == 0x7f000000);
  }
  else if (addr->sa_family == 10) {
    cVar8 = -(addr->sa_data[6] == '\0');
    cVar9 = -(addr->sa_data[7] == '\0');
    cVar10 = -(addr->sa_data[8] == '\0');
    cVar11 = -(addr->sa_data[9] == '\0');
    cVar12 = -(addr->sa_data[10] == '\0');
    cVar13 = -(addr->sa_data[0xb] == '\0');
    cVar14 = -(addr->sa_data[0xc] == '\0');
    cVar15 = -(addr->sa_data[0xd] == '\0');
    cVar16 = -((char)addr[1].sa_family == '\0');
    cVar17 = -(*(char *)((long)&addr[1].sa_family + 1) == '\0');
    cVar18 = -(addr[1].sa_data[0] == '\0');
    cVar19 = -(addr[1].sa_data[1] == '\0');
    cVar20 = -(addr[1].sa_data[2] == '\0');
    cVar21 = -(addr[1].sa_data[3] == '\0');
    cVar22 = -(addr[1].sa_data[4] == '\0');
    bVar23 = -(addr[1].sa_data[5] == '\x01');
    auVar1[1] = cVar9;
    auVar1[0] = cVar8;
    auVar1[2] = cVar10;
    auVar1[3] = cVar11;
    auVar1[4] = cVar12;
    auVar1[5] = cVar13;
    auVar1[6] = cVar14;
    auVar1[7] = cVar15;
    auVar1[8] = cVar16;
    auVar1[9] = cVar17;
    auVar1[10] = cVar18;
    auVar1[0xb] = cVar19;
    auVar1[0xc] = cVar20;
    auVar1[0xd] = cVar21;
    auVar1[0xe] = cVar22;
    auVar1[0xf] = bVar23;
    auVar2[1] = cVar9;
    auVar2[0] = cVar8;
    auVar2[2] = cVar10;
    auVar2[3] = cVar11;
    auVar2[4] = cVar12;
    auVar2[5] = cVar13;
    auVar2[6] = cVar14;
    auVar2[7] = cVar15;
    auVar2[8] = cVar16;
    auVar2[9] = cVar17;
    auVar2[10] = cVar18;
    auVar2[0xb] = cVar19;
    auVar2[0xc] = cVar20;
    auVar2[0xd] = cVar21;
    auVar2[0xe] = cVar22;
    auVar2[0xf] = bVar23;
    auVar6[1] = cVar11;
    auVar6[0] = cVar10;
    auVar6[2] = cVar12;
    auVar6[3] = cVar13;
    auVar6[4] = cVar14;
    auVar6[5] = cVar15;
    auVar6[6] = cVar16;
    auVar6[7] = cVar17;
    auVar6[8] = cVar18;
    auVar6[9] = cVar19;
    auVar6[10] = cVar20;
    auVar6[0xb] = cVar21;
    auVar6[0xc] = cVar22;
    auVar6[0xd] = bVar23;
    auVar5[1] = cVar12;
    auVar5[0] = cVar11;
    auVar5[2] = cVar13;
    auVar5[3] = cVar14;
    auVar5[4] = cVar15;
    auVar5[5] = cVar16;
    auVar5[6] = cVar17;
    auVar5[7] = cVar18;
    auVar5[8] = cVar19;
    auVar5[9] = cVar20;
    auVar5[10] = cVar21;
    auVar5[0xb] = cVar22;
    auVar5[0xc] = bVar23;
    auVar4[1] = cVar13;
    auVar4[0] = cVar12;
    auVar4[2] = cVar14;
    auVar4[3] = cVar15;
    auVar4[4] = cVar16;
    auVar4[5] = cVar17;
    auVar4[6] = cVar18;
    auVar4[7] = cVar19;
    auVar4[8] = cVar20;
    auVar4[9] = cVar21;
    auVar4[10] = cVar22;
    auVar4[0xb] = bVar23;
    auVar3[1] = cVar14;
    auVar3[0] = cVar13;
    auVar3[2] = cVar15;
    auVar3[3] = cVar16;
    auVar3[4] = cVar17;
    auVar3[5] = cVar18;
    auVar3[6] = cVar19;
    auVar3[7] = cVar20;
    auVar3[8] = cVar21;
    auVar3[9] = cVar22;
    auVar3[10] = bVar23;
    addr_local._4_4_ =
         (uint)(((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(bVar23,CONCAT18(cVar22,CONCAT17(cVar21,CONCAT16(
                                                  cVar20,CONCAT15(cVar19,CONCAT14(cVar18,CONCAT13(
                                                  cVar17,CONCAT12(cVar16,CONCAT11(cVar15,cVar14)))))
                                                  )))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(bVar23,CONCAT17(cVar22,CONCAT16(cVar21,CONCAT15(
                                                  cVar20,CONCAT14(cVar19,CONCAT13(cVar18,CONCAT12(
                                                  cVar17,CONCAT11(cVar16,cVar15)))))))) >> 7) & 1)
                          << 7 | (ushort)(bVar23 >> 7) << 0xf) != 0xffff ^ 0xffU) & 1);
  }
  else {
    addr_local._4_4_ = 0;
  }
  return addr_local._4_4_;
}

Assistant:

int
evutil_sockaddr_is_loopback_(const struct sockaddr *addr)
{
	static const char LOOPBACK_S6[16] =
	    "\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\1";
	if (addr->sa_family == AF_INET) {
		struct sockaddr_in *sin = (struct sockaddr_in *)addr;
		return (ntohl(sin->sin_addr.s_addr) & 0xff000000) == 0x7f000000;
	} else if (addr->sa_family == AF_INET6) {
		struct sockaddr_in6 *sin6 = (struct sockaddr_in6 *)addr;
		return !memcmp(sin6->sin6_addr.s6_addr, LOOPBACK_S6, 16);
	}
	return 0;
}